

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::ChromeLatencyInfo_ComponentInfo::ChromeLatencyInfo_ComponentInfo
          (ChromeLatencyInfo_ComponentInfo *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__ChromeLatencyInfo_ComponentInfo_003c80a8;
  this->component_type_ = ChromeLatencyInfo_LatencyComponentType_COMPONENT_UNSPECIFIED;
  this->time_us_ = 0;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

ChromeLatencyInfo_ComponentInfo::ChromeLatencyInfo_ComponentInfo() = default;